

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O1

void pangram_suite::test_danish(void)

{
  long lVar1;
  char *pcVar2;
  value_type *pvVar3;
  decoder_type decoder;
  char input [105];
  undefined4 local_1ec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_decoder<char> local_1c8;
  value_type local_98 [104];
  value_type local_30 [8];
  
  local_1c8.input.head = local_98;
  pcVar2 = 
  "\"Quizdeltagerne spiste jordb\\u00E6r med fl\\u00F8de, mens cirkusklovnen Wolther spillede p\\u00E5 xylofon\""
  ;
  pvVar3 = local_1c8.input.head;
  for (lVar1 = 0xd; lVar1 != 0; lVar1 = lVar1 + -1) {
    *(undefined8 *)pvVar3 = *(undefined8 *)pcVar2;
    pcVar2 = pcVar2 + 8;
    pvVar3 = pvVar3 + 8;
  }
  local_30[0] = '\0';
  local_1c8.input.tail = local_30;
  memset(&local_1c8.current,0,0x120);
  local_1c8.current.code = uninitialized;
  local_1c8.current.view.head = (const_pointer)0x0;
  local_1c8.current.view.tail = (const_pointer)0x0;
  trial::protocol::json::detail::basic_decoder<char>::assume_next(&local_1c8);
  local_1e8._M_dataplus._M_p._0_4_ = local_1c8.current.code;
  local_1ec = 10;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x907,"void pangram_suite::test_danish()",&local_1e8,&local_1ec);
  trial::protocol::json::detail::basic_decoder<char>::string_value<std::__cxx11::string>
            (&local_1e8,&local_1c8);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[91]>
            ("decoder.string_value<std::string>()",anon_var_dwarf_6fa7,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x908,"void pangram_suite::test_danish()",&local_1e8,anon_var_dwarf_6fb3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_1e8._M_dataplus._M_p._4_4_,(value)local_1e8._M_dataplus._M_p) !=
      &local_1e8.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_1e8._M_dataplus._M_p._4_4_,(value)local_1e8._M_dataplus._M_p),
                    local_1e8.field_2._M_allocated_capacity + 1);
  }
  if (error_unexpected_token < local_1c8.current.code) {
    if (local_1c8.current.code == end) {
      local_1c8.current.code = error_unexpected_token;
    }
    else {
      trial::protocol::json::detail::basic_decoder<char>::assume_next(&local_1c8);
    }
  }
  local_1e8._M_dataplus._M_p._0_4_ = local_1c8.current.code;
  local_1ec = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x90a,"void pangram_suite::test_danish()",&local_1e8,&local_1ec);
  return;
}

Assistant:

void test_danish()
{
    const char input[] = "\"Quizdeltagerne spiste jordb\\u00E6r med fl\\u00F8de, mens cirkusklovnen Wolther spillede p\\u00E5 xylofon\"";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::string);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.string_value<std::string>(), "Quizdeltagerne spiste jordbær med fløde, mens cirkusklovnen Wolther spillede på xylofon");
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}